

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this,TestPreset *param_1)

{
  pointer pbVar1;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_008a0a68;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  std::__cxx11::string::string((string *)&this->Configuration,(string *)&param_1->Configuration);
  pbVar1 = (param_1->OverwriteConfigurationFile).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->OverwriteConfigurationFile).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->OverwriteConfigurationFile).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>::_Optional_base
            (&(this->Output).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>,
             &(param_1->Output).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>);
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>::_Optional_base
            (&(this->Filter).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>,
             &(param_1->Filter).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>);
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>::
  _Optional_base(&(this->Execution).
                  super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                 ,&(param_1->Execution).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                );
  return;
}

Assistant:

TestPreset(TestPreset&& /*other*/) = default;